

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QGenericArrayOps<VkSpecParser::Command>::moveAppend
          (QGenericArrayOps<VkSpecParser::Command> *this,Command *b,Command *e)

{
  qsizetype *pqVar1;
  Command *pCVar2;
  long lVar3;
  Data *pDVar4;
  char16_t *pcVar5;
  qsizetype qVar6;
  Data *pDVar7;
  TypedName *pTVar8;
  
  if ((b != e) && (b < e)) {
    pCVar2 = (this->super_QArrayDataPointer<VkSpecParser::Command>).ptr;
    do {
      lVar3 = (this->super_QArrayDataPointer<VkSpecParser::Command>).size;
      pDVar4 = (b->cmd).name.d.d;
      (b->cmd).name.d.d = (Data *)0x0;
      pCVar2[lVar3].cmd.name.d.d = pDVar4;
      pcVar5 = (b->cmd).name.d.ptr;
      (b->cmd).name.d.ptr = (char16_t *)0x0;
      pCVar2[lVar3].cmd.name.d.ptr = pcVar5;
      qVar6 = (b->cmd).name.d.size;
      (b->cmd).name.d.size = 0;
      pCVar2[lVar3].cmd.name.d.size = qVar6;
      pDVar4 = (b->cmd).type.d.d;
      (b->cmd).type.d.d = (Data *)0x0;
      pCVar2[lVar3].cmd.type.d.d = pDVar4;
      pcVar5 = (b->cmd).type.d.ptr;
      (b->cmd).type.d.ptr = (char16_t *)0x0;
      pCVar2[lVar3].cmd.type.d.ptr = pcVar5;
      qVar6 = (b->cmd).type.d.size;
      (b->cmd).type.d.size = 0;
      pCVar2[lVar3].cmd.type.d.size = qVar6;
      pDVar4 = (b->cmd).typeSuffix.d.d;
      (b->cmd).typeSuffix.d.d = (Data *)0x0;
      pCVar2[lVar3].cmd.typeSuffix.d.d = pDVar4;
      pcVar5 = (b->cmd).typeSuffix.d.ptr;
      (b->cmd).typeSuffix.d.ptr = (char16_t *)0x0;
      pCVar2[lVar3].cmd.typeSuffix.d.ptr = pcVar5;
      qVar6 = (b->cmd).typeSuffix.d.size;
      (b->cmd).typeSuffix.d.size = 0;
      pCVar2[lVar3].cmd.typeSuffix.d.size = qVar6;
      pDVar7 = (b->args).d.d;
      (b->args).d.d = (Data *)0x0;
      pCVar2[lVar3].args.d.d = pDVar7;
      pTVar8 = (b->args).d.ptr;
      (b->args).d.ptr = (TypedName *)0x0;
      pCVar2[lVar3].args.d.ptr = pTVar8;
      qVar6 = (b->args).d.size;
      (b->args).d.size = 0;
      pCVar2[lVar3].args.d.size = qVar6;
      pCVar2[lVar3].deviceLevel = b->deviceLevel;
      b = b + 1;
      pqVar1 = &(this->super_QArrayDataPointer<VkSpecParser::Command>).size;
      *pqVar1 = *pqVar1 + 1;
    } while (b < e);
  }
  return;
}

Assistant:

void moveAppend(T *b, T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e)
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(std::move(*b));
            ++b;
            ++this->size;
        }
    }